

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall
jessilib::callback_with_iterations::operator()(callback_with_iterations *this,timer *in_timer)

{
  bool bVar1;
  memory_order mVar2;
  __int_type _Var3;
  __int_type _Var4;
  atomic<unsigned_long> *paVar5;
  __int_type local_90;
  __int_type iterations;
  cancel_detector detector;
  timer *in_timer_local;
  callback_with_iterations *this_local;
  memory_order __b;
  
  detector.m_context = (cancel_token_context *)in_timer;
  cancel_detector::cancel_detector((cancel_detector *)&iterations,&this->m_cancel_token);
  std::operator&(seq_cst,__memory_order_mask);
  local_90 = (this->m_iterations).super___atomic_base<unsigned_long>._M_i;
  do {
    if (local_90 == 0) goto LAB_0021dea3;
    paVar5 = &this->m_iterations;
    _Var3 = local_90 - 1;
    mVar2 = std::__cmpexch_failure_order(seq_cst);
    switch(0x21d91f) {
    default:
      if (mVar2 - consume < 2) {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      else if (mVar2 == seq_cst) {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      else {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      break;
    case 2:
      if (mVar2 - consume < 2) {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      else if (mVar2 == seq_cst) {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      else {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      break;
    case 3:
      if (mVar2 - consume < 2) {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      else if (mVar2 == seq_cst) {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      else {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      break;
    case 4:
      if (mVar2 - consume < 2) {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      else if (mVar2 == seq_cst) {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
      else {
        LOCK();
        _Var4 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        bVar1 = local_90 == _Var4;
        if (bVar1) {
          (paVar5->super___atomic_base<unsigned_long>)._M_i = _Var3;
          _Var4 = local_90;
        }
        UNLOCK();
        if (!bVar1) {
          local_90 = _Var4;
        }
      }
    }
  } while (!bVar1);
  std::function<void_(jessilib::timer_&)>::operator()(&this->m_callback,(timer *)detector.m_context)
  ;
  bVar1 = cancel_detector::expired((cancel_detector *)&iterations);
  if ((!bVar1) &&
     (_Var3 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base *)&this->m_iterations), _Var3 == 0)) {
    timer::cancel((timer *)detector.m_context);
  }
LAB_0021dea3:
  cancel_detector::~cancel_detector((cancel_detector *)&iterations);
  return;
}

Assistant:

void operator()(timer& in_timer) {
		cancel_detector detector{ m_cancel_token };

		auto iterations = m_iterations.load();
		do {
			// Ensure timer is not already expired
			if (iterations == 0) {
				return;
			}

			// Decrement iterations and cancel if necessary
		} while (!m_iterations.compare_exchange_weak(iterations, iterations - 1));

		// Call callback
		m_callback(in_timer);

		if (!detector.expired()) {
			if (m_iterations == 0) {
				// Cancel the timer
				in_timer.cancel();
			}
		}
	}